

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::ReleaseDragClone(Context *this)

{
  pointer child;
  ElementDocument *this_00;
  shared_ptr<Rml::StyleSheetContainer> local_28;
  undefined1 local_18 [16];
  Context *this_local;
  
  if (this->drag_clone != (Element *)0x0) {
    local_18._8_8_ = this;
    child = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                      (&this->cursor_proxy);
    Element::RemoveChild((Element *)local_18,child);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_18);
    this->drag_clone = (Element *)0x0;
    this_00 = (ElementDocument *)
              ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator*
                        (&this->cursor_proxy);
    ::std::shared_ptr<Rml::StyleSheetContainer>::shared_ptr(&local_28,(nullptr_t)0x0);
    ElementDocument::SetStyleSheetContainer(this_00,&local_28);
    ::std::shared_ptr<Rml::StyleSheetContainer>::~shared_ptr(&local_28);
  }
  return;
}

Assistant:

void Context::ReleaseDragClone()
{
	if (drag_clone)
	{
		cursor_proxy->RemoveChild(drag_clone);
		drag_clone = nullptr;
		static_cast<ElementDocument&>(*cursor_proxy).SetStyleSheetContainer(nullptr);
	}
}